

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SubqueryColumnTypes(Parse *pParse,Table *pTab,Select *pSelect,char aff)

{
  long lVar1;
  sqlite3 *psVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  Expr *pExpr;
  char *pcVar8;
  CollSeq *pCVar9;
  undefined1 in_CL;
  sqlite3 *in_RDX;
  NameContext *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  i64 k;
  Select *pS2;
  int m;
  i64 n;
  char *zType;
  ExprList_item *a;
  Expr *p;
  int j;
  int i;
  CollSeq *pColl;
  Column *pCol;
  sqlite3 *db;
  NameContext sNC;
  Expr *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  Column *in_stack_ffffffffffffff48;
  long lVar10;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar11;
  sqlite3 *db_00;
  Parse *pParse_00;
  int local_80;
  int local_7c;
  SrcList *pzOrigCol;
  char **pzOrigTab;
  undefined7 in_stack_ffffffffffffffa0;
  sqlite3 *pExpr_00;
  undefined1 local_40 [8];
  undefined8 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pzOrigTab = (char **)*in_RDI;
  memset(local_40,0xaa,0x38);
  if ((*(char *)((long)pzOrigTab + 0x67) == '\0') && (*(byte *)((long)in_RDI + 0x134) < 2)) {
    for (; lVar1._0_4_ = in_RDX->errCode, lVar1._4_4_ = in_RDX->errByteOffset, lVar1 != 0;
        in_RDX = *(sqlite3 **)&in_RDX->errCode) {
    }
    pParse_00 = (Parse *)&in_RDX->aDb->pBt;
    memset(local_40,0,0x38);
    local_38._0_4_ = in_RDX->nDb;
    local_38._4_4_ = in_RDX->mDbFlags;
    local_7c = 0;
    pzOrigCol = in_RSI->pSrcList;
    for (; local_7c < *(short *)((long)&in_RSI->pWinSelect + 6); local_7c = local_7c + 1) {
      db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
      uVar11 = 0;
      *(uint *)&in_RSI->pWinSelect =
           *(ushort *)((long)&pzOrigCol->a[0].zName + 6) & 0x62 | *(uint *)&in_RSI->pWinSelect;
      psVar2 = (&pParse_00->db)[(long)local_7c * 3];
      pExpr_00 = in_RDX;
      cVar5 = sqlite3ExprAffinity(in_stack_ffffffffffffff38);
      *(char *)((long)&pzOrigCol->a[0].zName + 1) = cVar5;
      while( true ) {
        uVar6 = in_stack_ffffffffffffff44 & 0xffffff;
        if (*(char *)((long)&pzOrigCol->a[0].zName + 1) < 'A') {
          lVar3._0_4_ = in_RDX->errMask;
          lVar3._4_4_ = in_RDX->iSysErrno;
          uVar6 = CONCAT13(lVar3 != 0,(int3)in_stack_ffffffffffffff44);
        }
        in_stack_ffffffffffffff44 = uVar6;
        if ((char)(in_stack_ffffffffffffff44 >> 0x18) == '\0') break;
        uVar6 = sqlite3ExprDataType((Expr *)CONCAT44(uVar11,in_stack_ffffffffffffff58));
        uVar11 = uVar6 | uVar11;
        in_RDX = *(sqlite3 **)&in_RDX->errMask;
        cVar5 = sqlite3ExprAffinity(in_stack_ffffffffffffff38);
        *(char *)((long)&pzOrigCol->a[0].zName + 1) = cVar5;
      }
      if (*(char *)((long)&pzOrigCol->a[0].zName + 1) < 'A') {
        *(undefined1 *)((long)&pzOrigCol->a[0].zName + 1) = in_CL;
      }
      if (('A' < *(char *)((long)&pzOrigCol->a[0].zName + 1)) &&
         ((lVar4._0_4_ = in_RDX->errMask, lVar4._4_4_ = in_RDX->iSysErrno, lVar4 != 0 ||
          (in_RDX != pExpr_00)))) {
        lVar10._0_4_ = in_RDX->errMask;
        lVar10._4_4_ = in_RDX->iSysErrno;
        for (; lVar10 != 0; lVar10 = *(long *)(lVar10 + 0x58)) {
          uVar6 = sqlite3ExprDataType((Expr *)CONCAT44(uVar11,in_stack_ffffffffffffff58));
          uVar11 = uVar6 | uVar11;
        }
        if ((*(char *)((long)&pzOrigCol->a[0].zName + 1) == 'B') && ((uVar11 & 1) != 0)) {
          *(undefined1 *)((long)&pzOrigCol->a[0].zName + 1) = 0x41;
        }
        else if (('B' < *(char *)((long)&pzOrigCol->a[0].zName + 1)) && ((uVar11 & 2) != 0)) {
          *(undefined1 *)((long)&pzOrigCol->a[0].zName + 1) = 0x41;
        }
        if (('B' < *(char *)((long)&pzOrigCol->a[0].zName + 1)) && (*(char *)&psVar2->pVfs == '$'))
        {
          *(undefined1 *)((long)&pzOrigCol->a[0].zName + 1) = 0x46;
        }
        in_RDX = (sqlite3 *)0x0;
      }
      pExpr = (Expr *)columnTypeImpl(in_RSI,(Expr *)pExpr_00,
                                     (char **)CONCAT17(in_CL,in_stack_ffffffffffffffa0),pzOrigTab,
                                     (char **)pzOrigCol);
      if (pExpr == (Expr *)0x0) {
LAB_001e1cd1:
        if ((*(char *)((long)&pzOrigCol->a[0].zName + 1) == 'C') ||
           (*(char *)((long)&pzOrigCol->a[0].zName + 1) == 'F')) {
          pExpr = (Expr *)0x2b4127;
        }
        else {
          pExpr = (Expr *)0x0;
          for (local_80 = 1; local_80 < 6; local_80 = local_80 + 1) {
            if ("CADDEB"[local_80] == *(char *)((long)&pzOrigCol->a[0].zName + 1)) {
              pExpr = (Expr *)sqlite3StdType[local_80];
              break;
            }
          }
        }
      }
      else {
        in_stack_ffffffffffffff40 = (int)*(char *)((long)&pzOrigCol->a[0].zName + 1);
        cVar5 = sqlite3AffinityType((char *)in_RDX,in_stack_ffffffffffffff48);
        if (in_stack_ffffffffffffff40 != cVar5) goto LAB_001e1cd1;
      }
      if (pExpr != (Expr *)0x0) {
        iVar7 = sqlite3Strlen30((char *)in_stack_ffffffffffffff38);
        in_stack_ffffffffffffff48 = (Column *)(long)iVar7;
        iVar7 = sqlite3Strlen30((char *)in_stack_ffffffffffffff38);
        db_00 = (sqlite3 *)(long)iVar7;
        pcVar8 = (char *)sqlite3DbReallocOrFree
                                   (in_RDX,in_stack_ffffffffffffff48,
                                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        *(char **)pzOrigCol = pcVar8;
        *(ushort *)((long)&pzOrigCol->a[0].zName + 6) =
             *(ushort *)((long)&pzOrigCol->a[0].zName + 6) & 0xfdfb;
        if (*(char **)pzOrigCol != (char *)0x0) {
          memcpy(*(char **)pzOrigCol + (long)((long)&db_00->pVfs + 1),pExpr,
                 (size_t)((long)&in_stack_ffffffffffffff48->zCnName + 1));
          *(ushort *)((long)&pzOrigCol->a[0].zName + 6) =
               *(ushort *)((long)&pzOrigCol->a[0].zName + 6) | 4;
        }
      }
      pCVar9 = sqlite3ExprCollSeq(pParse_00,pExpr);
      if (pCVar9 != (CollSeq *)0x0) {
        sqlite3ColumnSetColl
                  (db_00,(Column *)CONCAT44(uVar11,in_stack_ffffffffffffff58),(char *)in_RDX);
      }
      pzOrigCol = (SrcList *)&pzOrigCol->a[0].zAlias;
      in_RDX = pExpr_00;
    }
    *(undefined2 *)((long)&in_RSI[1].pParse + 4) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SubqueryColumnTypes(
  Parse *pParse,      /* Parsing contexts */
  Table *pTab,        /* Add column type information to this table */
  Select *pSelect,    /* SELECT used to determine types and collations */
  char aff            /* Default affinity. */
){
  sqlite3 *db = pParse->db;
  Column *pCol;
  CollSeq *pColl;
  int i,j;
  Expr *p;
  struct ExprList_item *a;
  NameContext sNC;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || pParse->nErr>0 );
  assert( aff==SQLITE_AFF_NONE || aff==SQLITE_AFF_BLOB );
  if( db->mallocFailed || IN_RENAME_OBJECT ) return;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  a = pSelect->pEList->a;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    i64 n;
    int m = 0;
    Select *pS2 = pSelect;
    pTab->tabFlags |= (pCol->colFlags & COLFLAG_NOINSERT);
    p = a[i].pExpr;
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    while( pCol->affinity<=SQLITE_AFF_NONE && pS2->pNext!=0 ){
      m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      pS2 = pS2->pNext;
      pCol->affinity = sqlite3ExprAffinity(pS2->pEList->a[i].pExpr);
    }
    if( pCol->affinity<=SQLITE_AFF_NONE ){
      pCol->affinity = aff;
    }
    if( pCol->affinity>=SQLITE_AFF_TEXT && (pS2->pNext || pS2!=pSelect) ){
      for(pS2=pS2->pNext; pS2; pS2=pS2->pNext){
        m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      }
      if( pCol->affinity==SQLITE_AFF_TEXT && (m&0x01)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }else
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && (m&0x02)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && p->op==TK_CAST ){
        pCol->affinity = SQLITE_AFF_FLEXNUM;
      }
    }
    zType = columnType(&sNC, p, 0, 0, 0);
    if( zType==0 || pCol->affinity!=sqlite3AffinityType(zType, 0) ){
      if( pCol->affinity==SQLITE_AFF_NUMERIC
       || pCol->affinity==SQLITE_AFF_FLEXNUM
      ){
        zType = "NUM";
      }else{
        zType = 0;
        for(j=1; j<SQLITE_N_STDTYPE; j++){
          if( sqlite3StdTypeAffinity[j]==pCol->affinity ){
            zType = sqlite3StdType[j];
            break;
          }
        }
      }
    }
    if( zType ){
      const i64 k = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zCnName);
      pCol->zCnName = sqlite3DbReallocOrFree(db, pCol->zCnName, n+k+2);
      pCol->colFlags &= ~(COLFLAG_HASTYPE|COLFLAG_HASCOLL);
      if( pCol->zCnName ){
        memcpy(&pCol->zCnName[n+1], zType, k+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl ){
      assert( pTab->pIndex==0 );
      sqlite3ColumnSetColl(db, pCol, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}